

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getDualUnboundednessDirection
                   (void *highs,HighsInt *has_dual_unboundedness_direction,
                   double *dual_unboundedness_direction_value)

{
  HighsStatus HVar1;
  undefined4 in_register_00000004;
  bool v;
  bool local_11;
  
  local_11 = SUB41((uint)in_register_00000004 >> 0x18,0);
  HVar1 = Highs::getDualUnboundednessDirection
                    ((Highs *)highs,&local_11,dual_unboundedness_direction_value);
  *has_dual_unboundedness_direction = (uint)local_11;
  return HVar1;
}

Assistant:

HighsInt Highs_getDualUnboundednessDirection(
    const void* highs, HighsInt* has_dual_unboundedness_direction,
    double* dual_unboundedness_direction_value) {
  bool v;
  HighsInt retcode = (HighsInt)((Highs*)highs)
                         ->getDualUnboundednessDirection(
                             v, dual_unboundedness_direction_value);
  *has_dual_unboundedness_direction = (HighsInt)v;
  return retcode;
}